

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::OpenPopupEx(ImGuiID id)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  ImVec2 IVar6;
  ImGuiPopupRef *pIVar7;
  ImVec2 IVar8;
  ImGuiContext *pIVar9;
  long lVar10;
  ImGuiPopupRef *pIVar11;
  int iVar12;
  int iVar13;
  
  pIVar9 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  lVar10 = (long)(pIVar5->IDStack).Size;
  if (0 < lVar10) {
    iVar1 = (GImGui->CurrentPopupStack).Size;
    iVar2 = GImGui->FrameCount;
    uVar3 = (pIVar5->IDStack).Data[lVar10 + -1];
    IVar6 = (GImGui->IO).MousePos;
    IVar8 = NavCalcPreferredRefPos();
    iVar4 = (pIVar9->OpenPopupStack).Size;
    if (iVar1 < iVar4) {
      iVar13 = iVar1 + 1;
      iVar4 = (pIVar9->OpenPopupStack).Capacity;
      if (iVar4 <= iVar1) {
        if (iVar4 == 0) {
          iVar12 = 8;
        }
        else {
          iVar12 = iVar4 / 2 + iVar4;
        }
        if (iVar12 <= iVar13) {
          iVar12 = iVar13;
        }
        if (iVar4 < iVar12) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
          pIVar11 = (ImGuiPopupRef *)
                    (*GImAllocatorAllocFunc)((long)iVar12 * 0x30,GImAllocatorUserData);
          pIVar7 = (pIVar9->OpenPopupStack).Data;
          if (pIVar7 != (ImGuiPopupRef *)0x0) {
            memcpy(pIVar11,pIVar7,(long)(pIVar9->OpenPopupStack).Size * 0x30);
            pIVar7 = (pIVar9->OpenPopupStack).Data;
            if (pIVar7 != (ImGuiPopupRef *)0x0) {
              GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
            }
            (*GImAllocatorFreeFunc)(pIVar7,GImAllocatorUserData);
          }
          (pIVar9->OpenPopupStack).Data = pIVar11;
          (pIVar9->OpenPopupStack).Capacity = iVar12;
        }
      }
      (pIVar9->OpenPopupStack).Size = iVar13;
      pIVar11 = (pIVar9->OpenPopupStack).Data;
      pIVar7 = pIVar11 + iVar1;
      if ((pIVar11[iVar1].PopupId == id) && (pIVar7->OpenFrameCount == pIVar9->FrameCount + -1)) {
        pIVar7->OpenFrameCount = iVar2;
      }
      else {
        pIVar7->PopupId = id;
        pIVar7->Window = (ImGuiWindow *)0x0;
        pIVar7->ParentWindow = pIVar5;
        pIVar7->OpenFrameCount = iVar2;
        pIVar7->OpenParentId = uVar3;
        pIVar7->OpenPopupPos = IVar8;
        pIVar7->OpenMousePos = IVar6;
      }
    }
    else {
      iVar1 = (pIVar9->OpenPopupStack).Capacity;
      if (iVar4 == iVar1) {
        if (iVar1 == 0) {
          iVar13 = 8;
        }
        else {
          iVar13 = iVar1 / 2 + iVar1;
        }
        iVar12 = iVar4 + 1;
        if (iVar4 + 1 < iVar13) {
          iVar12 = iVar13;
        }
        if (iVar1 < iVar12) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
          pIVar11 = (ImGuiPopupRef *)
                    (*GImAllocatorAllocFunc)((long)iVar12 * 0x30,GImAllocatorUserData);
          pIVar7 = (pIVar9->OpenPopupStack).Data;
          if (pIVar7 != (ImGuiPopupRef *)0x0) {
            memcpy(pIVar11,pIVar7,(long)(pIVar9->OpenPopupStack).Size * 0x30);
            pIVar7 = (pIVar9->OpenPopupStack).Data;
            if (pIVar7 != (ImGuiPopupRef *)0x0) {
              GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
            }
            (*GImAllocatorFreeFunc)(pIVar7,GImAllocatorUserData);
          }
          (pIVar9->OpenPopupStack).Data = pIVar11;
          (pIVar9->OpenPopupStack).Capacity = iVar12;
        }
      }
      pIVar7 = (pIVar9->OpenPopupStack).Data;
      iVar1 = (pIVar9->OpenPopupStack).Size;
      pIVar7[iVar1].PopupId = id;
      pIVar7[iVar1].Window = (ImGuiWindow *)0x0;
      pIVar7[iVar1].ParentWindow = pIVar5;
      pIVar7[iVar1].OpenFrameCount = iVar2;
      pIVar7[iVar1].OpenParentId = uVar3;
      pIVar7[iVar1].OpenPopupPos = IVar8;
      pIVar7[iVar1].OpenMousePos = IVar6;
      (pIVar9->OpenPopupStack).Size = (pIVar9->OpenPopupStack).Size + 1;
    }
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                ,0x4ca,"value_type &ImVector<unsigned int>::back() [T = unsigned int]");
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    int current_stack_size = g.CurrentPopupStack.Size;
    ImGuiPopupRef popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.ParentWindow = parent_window;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenMousePos = g.IO.MousePos;
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();

    //printf("[%05d] OpenPopupEx(0x%08X)\n", g.FrameCount, id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Close child popups if any
        g.OpenPopupStack.resize(current_stack_size + 1);

        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        else
            g.OpenPopupStack[current_stack_size] = popup_ref;

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}